

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_add_order *m)

{
  char *pcVar1;
  order_book *this_00;
  char cVar2;
  undefined1 auVar3 [48];
  side_type sVar4;
  undefined8 uVar5;
  _Hash_node_base *p_Var6;
  itch_add_order *piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  _Hash_node_base *p_Var14;
  char *end;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  undefined7 uStack_7f;
  undefined1 local_70 [64];
  
  pcVar1 = m->OrderBook;
  lVar10 = 0;
  do {
    if (pcVar1[lVar10] != ' ') {
      pcVar11 = pcVar1 + lVar10;
      break;
    }
    lVar10 = lVar10 + 1;
    pcVar11 = m->Price;
  } while (lVar10 != 6);
  p_Var6 = (_Hash_node_base *)0x0;
  for (; pcVar11 != m->Price; pcVar11 = pcVar11 + 1) {
    p_Var6 = (_Hash_node_base *)(((long)*pcVar11 + (long)p_Var6 * 10) - 0x30);
  }
  uVar9 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar12 = (ulong)p_Var6 % uVar9;
  p_Var15 = (this->order_book_id_map)._M_h._M_buckets[uVar12];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var14 = p_Var15->_M_nxt, p_Var16 = p_Var15, p_Var6 != p_Var15->_M_nxt[1]._M_nxt)) {
    while (p_Var15 = p_Var14, p_Var14 = p_Var15->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)p_Var14[1]._M_nxt % uVar9 != uVar12) ||
         (p_Var16 = p_Var15, p_Var6 == p_Var14[1]._M_nxt)) goto LAB_00117622;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_00117622:
  if (p_Var16 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var16->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)(p_Var6 + 2);
    lVar10 = 1;
    do {
      if (m->OrderReferenceNumber[lVar10 + -1] != ' ') {
        pcVar11 = m->OrderReferenceNumber + lVar10 + -1;
        break;
      }
      lVar10 = lVar10 + 1;
      pcVar11 = &m->BuySellIndicator;
    } while (lVar10 != 10);
    lVar10 = 0;
    for (; pcVar11 != &m->BuySellIndicator; pcVar11 = pcVar11 + 1) {
      lVar10 = (long)*pcVar11 + lVar10 * 10 + -0x30;
    }
    lVar13 = 0;
    do {
      if (m->Price[lVar13] != ' ') {
        piVar7 = (itch_add_order *)(m->Price + lVar13);
        break;
      }
      lVar13 = lVar13 + 1;
      piVar7 = m + 1;
    } while (lVar13 != 10);
    lVar13 = 0;
    for (; piVar7 != m + 1; piVar7 = (itch_add_order *)piVar7->OrderReferenceNumber) {
      lVar13 = (long)piVar7->MsgType + lVar13 * 10 + -0x30;
    }
    lVar8 = 0;
    do {
      if (m->Quantity[lVar8] != ' ') {
        pcVar11 = m->Quantity + lVar8;
        break;
      }
      lVar8 = lVar8 + 1;
      pcVar11 = pcVar1;
    } while (lVar8 != 9);
    if (pcVar11 == pcVar1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        cVar2 = *pcVar11;
        pcVar11 = pcVar11 + 1;
        uVar9 = ((long)cVar2 + uVar9 * 10) - 0x30;
      } while (pcVar11 != pcVar1);
      uVar9 = uVar9 & 0xffffffff;
    }
    sVar4 = itch_side(m->BuySellIndicator);
    auVar3._25_7_ = uStack_7f;
    auVar3[0x18] = sVar4;
    auVar3._8_8_ = lVar13;
    auVar3._0_8_ = lVar10;
    auVar3._16_8_ = uVar9;
    auVar3._32_8_ = this->time_sec * 1000 + this->time_msec;
    auVar3._40_8_ = 0;
    order_book::add(this_00,(order)(auVar3 << 0x40));
    local_70._0_8_ = lVar10;
    local_70._8_8_ = this_00;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_id_map);
    p_Var14 = (_Hash_node_base *)(this->time_sec * 1000 + this->time_msec);
    p_Var6[6]._M_nxt = p_Var14;
    make_ob_event((event *)local_70,(string *)this_00,(uint64_t)p_Var14,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      if ((order_book *)local_70._8_8_ != (order_book *)(local_70 + 0x18)) {
        operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
      }
      _Unwind_Resume(uVar5);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,(event *)local_70);
    if ((order_book *)local_70._8_8_ != (order_book *)(local_70 + 0x18)) {
      operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_add_order* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
        uint64_t price    = itch_uatoi(m->Price, sizeof(m->Price));;
        uint32_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));;
        auto     side     = itch_side(m->BuySellIndicator);

        order o{order_id, price, quantity, side, timestamp()};
        ob.add(std::move(o));

        order_id_map.insert({order_id, ob});
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}